

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Unsigned1(ByteCodeWriter *this,OpCode op,uint C1)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_1c;
  uint uStack_18;
  bool success;
  OpCode local_12;
  uint C1_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_18 = C1;
  local_12 = op;
  _C1_local = this;
  CheckOpen(this);
  op_00 = local_12;
  OpLayoutType::OpLayoutType(&local_1c,Unsigned1);
  CheckOp(this,op_00,local_1c);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_12);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2a3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,local_12,uStack_18);
  if (((!bVar2) &&
      (bVar2 = TryWriteUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,local_12,uStack_18),
      !bVar2)) &&
     (bVar2 = TryWriteUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,local_12,uStack_18),
     !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2a5,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Unsigned1(OpCode op, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(Unsigned1, op, C1);
    }